

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCommonHandler.c
# Opt level: O1

uint32_t sbfMcastTopicResolver_makeAddress(sbfMcastTopicResolver mtr,sbfTopic topic)

{
  uint uVar1;
  u_int uVar2;
  uint uVar3;
  u_int uVar4;
  uint uVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  uVar5 = mtr->mBase;
  pbVar6 = (byte *)sbfTopic_getFirst(topic);
  uVar8 = 0x1505;
  uVar10 = 0x1505;
  bVar7 = *pbVar6;
  while (bVar7 != 0) {
    pbVar6 = pbVar6 + 1;
    uVar10 = (uint)bVar7 + uVar10 * 0x21;
    bVar7 = *pbVar6;
  }
  uVar1 = mtr->mFirstSize;
  uVar2 = mtr->mFirstShift;
  pbVar6 = (byte *)sbfTopic_getSecond(topic);
  bVar7 = *pbVar6;
  if (bVar7 != 0) {
    uVar8 = 0x1505;
    do {
      pbVar6 = pbVar6 + 1;
      uVar8 = (uint)bVar7 + uVar8 * 0x21;
      bVar7 = *pbVar6;
    } while (bVar7 != 0);
  }
  uVar3 = mtr->mSecondSize;
  uVar4 = mtr->mSecondShift;
  pbVar6 = (byte *)sbfTopic_getThird(topic);
  bVar7 = *pbVar6;
  if (bVar7 == 0) {
    iVar9 = 0x1505;
  }
  else {
    iVar9 = 0x1505;
    do {
      pbVar6 = pbVar6 + 1;
      iVar9 = (uint)bVar7 + iVar9 * 0x21;
      bVar7 = *pbVar6;
    } while (bVar7 != 0);
  }
  bVar7 = (byte)uVar4 & 0x1f;
  uVar5 = (int)(CONCAT44(0 << bVar7,iVar9) % (ulong)mtr->mThirdSize) + 1U |
          uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18 |
          uVar10 % uVar1 << ((byte)uVar2 & 0x1f) | uVar8 % uVar3 << bVar7;
  return uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
}

Assistant:

uint32_t
sbfMcastTopicResolver_makeAddress (sbfMcastTopicResolver mtr, sbfTopic topic)
{
    uint32_t h;
    uint32_t address;

    address = ntohl (mtr->mBase);

    h = hash32_str (sbfTopic_getFirst (topic), HASHINIT);
    address |= (h % mtr->mFirstSize) << mtr->mFirstShift;

    h = hash32_str (sbfTopic_getSecond (topic), HASHINIT);
    address |= (h % mtr->mSecondSize) << mtr->mSecondShift;

    h = hash32_str (sbfTopic_getThird (topic), HASHINIT);
    address |= 1 + (h % mtr->mThirdSize);

    return htonl (address);
}